

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::XMLURL::operator==(XMLURL *this,XMLURL *toCompare)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  bool bVar5;
  
  pXVar4 = this->fURLText;
  if (pXVar4 == (XMLCh *)0x0) {
    buildFullText(this);
    pXVar4 = this->fURLText;
  }
  pXVar3 = toCompare->fURLText;
  if (pXVar3 == (XMLCh *)0x0) {
    buildFullText(toCompare);
    pXVar3 = toCompare->fURLText;
  }
  bVar5 = true;
  if (pXVar4 != pXVar3) {
    if (pXVar3 == (XMLCh *)0x0 || pXVar4 == (XMLCh *)0x0) {
      if (pXVar4 == (XMLCh *)0x0) {
        if (pXVar3 == (XMLCh *)0x0) {
          return true;
        }
      }
      else if (*pXVar4 != L'\0' || pXVar3 == (XMLCh *)0x0) {
        return *pXVar4 == L'\0';
      }
LAB_00256c4b:
      bVar5 = *pXVar3 == L'\0';
    }
    else {
      do {
        XVar1 = *pXVar4;
        if (XVar1 == L'\0') goto LAB_00256c4b;
        pXVar4 = pXVar4 + 1;
        XVar2 = *pXVar3;
        pXVar3 = pXVar3 + 1;
      } while (XVar1 == XVar2);
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool XMLURL::operator==(const XMLURL& toCompare) const
{
    //
    //  Compare the two complete URLs (which have been processed the same
    //  way so they should now be the same even if they came in via different
    //  relative parts.
    //
    if (!XMLString::equals(getURLText(), toCompare.getURLText()))
        return false;

    return true;
}